

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepTrim::Read(ON_BrepTrim *this,ON_BinaryArchive *file)

{
  ON_Interval domain;
  ON_Interval domain_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ON_Interval OVar5;
  int i;
  ON_3dPoint P [2];
  ISO local_6c;
  ON_Interval local_68;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_trim_index);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_c2i);
  }
  if (bVar1 != false) {
    ON_Interval::ON_Interval((ON_Interval *)&local_58);
    bVar1 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)&local_58);
    if (bVar1) {
      OVar5.m_t[0]._1_7_ = local_58.x._1_7_;
      OVar5.m_t[0]._0_1_ = local_58.x._0_1_;
      OVar5.m_t[1] = local_58.y;
      ON_CurveProxy::SetProxyCurveDomain(&this->super_ON_CurveProxy,OVar5);
      domain_00.m_t[0]._1_7_ = local_58.x._1_7_;
      domain_00.m_t[0]._0_1_ = local_58.x._0_1_;
      domain_00.m_t[1] = local_58.y;
      ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain_00);
    }
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_ei);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,2,this->m_vi);
  }
  if (bVar1 != false) {
    local_6c = (ISO)this->m_bRev3d;
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
    if (bVar1) {
      this->m_bRev3d = local_6c != not_iso;
    }
  }
  local_6c = not_iso;
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
  }
  if (local_6c < E_iso) {
    this->m_type = local_6c;
  }
  local_6c = not_iso;
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
  }
  if (local_6c < iso_count) {
    this->m_iso = local_6c;
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_li);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadDouble(file,2,this->m_tolerance);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  if (2 < iVar2) {
    uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
    if (0xbeee763 < uVar3) {
      OVar5 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
      local_68.m_t[1] = OVar5.m_t[1];
      local_68.m_t[0] = OVar5.m_t[0];
      if (bVar1 != false) {
        bVar1 = ON_BinaryArchive::ReadInterval(file,&local_68);
        if (!bVar1) {
          OVar5 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
          local_68.m_t[1] = OVar5.m_t[1];
          local_68.m_t[0] = OVar5.m_t[0];
        }
      }
      local_58.x._0_1_ = '\0';
      local_58.x._1_7_ = 0;
      local_58.y = 0.0;
      local_58.z = 0.0;
      if (bVar1 == false) {
        bVar4 = false;
        bVar1 = false;
      }
      else {
        bVar1 = ON_BinaryArchive::ReadChar(file,8,(ON__UINT8 *)&local_58);
        bVar4 = local_58.x._0_1_ == '\x01' && bVar1;
      }
      if (bVar1 != false) {
        bVar1 = ON_BinaryArchive::ReadChar(file,0x18,(ON__UINT8 *)&local_58);
      }
      if (bVar4) {
        ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
      }
      domain.m_t[1] = local_68.m_t[1];
      domain.m_t[0] = local_68.m_t[0];
      ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain);
      goto LAB_004090a9;
    }
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadPoint(file,&local_58);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadPoint(file,&local_40);
  }
LAB_004090a9:
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m__legacy_2d_tol);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m__legacy_3d_tol);
  }
  return bVar1;
}

Assistant:

bool ON_BrepTrim::Read( ON_BinaryArchive& file )
{
  ON_3dPoint P[2];
  int i;
  bool rc = file.ReadInt( &m_trim_index );
  if ( rc )
    rc = file.ReadInt( &m_c2i );
  if ( rc )
  {
    ON_Interval d;
    rc = file.ReadInterval( d );
    if (rc)
    {
      SetProxyCurveDomain(d);
      SetDomain(d);
    }
  }
  if ( rc )
    rc = file.ReadInt( &m_ei );
  if ( rc )
    rc = file.ReadInt( 2, m_vi );
  if ( rc )
  {
    i = m_bRev3d;
    rc = file.ReadInt( &i );
    if (rc)
      m_bRev3d = (i!=0);
  }

  i = unknown;
  if ( rc )
    rc = file.ReadInt( &i );
  switch (i) {
  case unknown:
    m_type = unknown;
    break;
  case boundary:
    m_type = boundary;
    break;
  case mated:
    m_type = mated;
    break;
  case seam:
    m_type = seam;
    break;
  case singular:
    m_type = singular;
    break;
  }

  i = ON_Surface::not_iso;
  if ( rc )
    rc = file.ReadInt( &i );
  switch(i) {
  case ON_Surface::not_iso:
    m_iso = ON_Surface::not_iso;
    break;
  case ON_Surface::x_iso:
    m_iso = ON_Surface::x_iso;
    break;
  case ON_Surface::y_iso:
    m_iso = ON_Surface::y_iso;
    break;
  case ON_Surface::W_iso:
    m_iso = ON_Surface::W_iso;
    break;
  case ON_Surface::S_iso:
    m_iso = ON_Surface::S_iso;
    break;
  case ON_Surface::E_iso:
    m_iso = ON_Surface::E_iso;
    break;
  case ON_Surface::N_iso:
    m_iso = ON_Surface::N_iso;
    break;
  }

  if ( rc )
    rc = file.ReadInt( &m_li );
  if ( rc )
    rc = file.ReadDouble( 2, m_tolerance );
  if ( file.Archive3dmVersion() >= 3 && file.ArchiveOpenNURBSVersion() >= 200206180 )
  {
    // read trim proxy curve information added in version 200206180
    ON_Interval d = ProxyCurveDomain();
    if (rc )
    {
      rc = file.ReadInterval( d );
      if ( !rc )
        d = ProxyCurveDomain();
    }
    unsigned char b[24];
    memset(b,0,sizeof(b));
    bool bProxyCurveIsReversed = false;
    if (rc)
    {
      rc = file.ReadChar(8,b);
      if (rc && b[0] == 1 )
        bProxyCurveIsReversed = true;
    }
    if (rc)
      rc = file.ReadChar(24,b);

    if ( bProxyCurveIsReversed )
      ON_CurveProxy::Reverse();
    SetDomain(d);
  }
  else
  {
    if ( rc )
      rc = file.ReadPoint( P[0] ); //m_P[0] );
    if ( rc )
      rc = file.ReadPoint( P[1] ); //m_P[1] );
  }
  if ( rc )
    rc = file.ReadDouble( &m__legacy_2d_tol );
  if ( rc )
    rc = file.ReadDouble( &m__legacy_3d_tol );
  return rc;
}